

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SkipList.hpp
# Opt level: O0

int __thiscall
Lib::
SkipList<Inferences::ALASCA::BinaryResolutionConf::Lhs,_Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::LDComparator>
::size(SkipList<Inferences::ALASCA::BinaryResolutionConf::Lhs,_Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::LDComparator>
       *this)

{
  bool bVar1;
  SkipList<Inferences::ALASCA::BinaryResolutionConf::Lhs,_Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::LDComparator>
  *in_RDI;
  Iterator it;
  int res;
  Iterator *in_stack_ffffffffffffffb8;
  Iterator local_18;
  int local_c;
  
  local_c = 0;
  Iterator::Iterator(&local_18,in_RDI);
  while( true ) {
    bVar1 = Iterator::hasNext(&local_18);
    if (!bVar1) break;
    Iterator::next(in_stack_ffffffffffffffb8);
    Inferences::ALASCA::BinaryResolutionConf::Lhs::~Lhs((Lhs *)0x42bff5);
    local_c = local_c + 1;
  }
  return local_c;
}

Assistant:

int size() const
  {
    int res=0;
    Iterator it(*this);
    while(it.hasNext()) {
      it.next();
      res++;
    }
    return res;
  }